

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

deUint64 deqp::gles3::Performance::anon_unknown_1::medianTimeMemcpy
                   (void *dst,void *src,int numBytes)

{
  int iVar1;
  deUint64 dVar2;
  deUint64 dVar3;
  ulong uVar4;
  int sectionNdx;
  long lVar5;
  ulong uVar6;
  int sectionStarts [6];
  int sectionLens [5];
  deUint64 sectionTimes [5];
  uint local_98 [8];
  int aiStack_78 [8];
  ulong local_58 [5];
  
  if (numBytes < 0x100000) {
    deYield();
    dVar2 = deGetMicroseconds();
    memcpy(dst,src,(long)numBytes);
    dVar3 = deGetMicroseconds();
    dVar3 = dVar3 - dVar2;
  }
  else {
    iVar1 = 0;
    lVar5 = 0;
    do {
      local_98[lVar5] = iVar1 / 5 + 0xfU & 0xfffffff0;
      lVar5 = lVar5 + 1;
      iVar1 = iVar1 + numBytes;
    } while (lVar5 != 5);
    local_98[5] = numBytes;
    lVar5 = 0;
    do {
      aiStack_78[lVar5] = local_98[lVar5 + 1] - local_98[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 5);
    deYield();
    tcu::warmupCPU();
    deYield();
    lVar5 = 0;
    uVar6 = 0;
    do {
      dVar3 = deGetMicroseconds();
      memcpy((void *)((long)dst + (long)*(int *)((long)local_98 + lVar5)),
             (void *)((long)*(int *)((long)local_98 + lVar5) + (long)src),
             (long)*(int *)((long)aiStack_78 + lVar5));
      dVar2 = deGetMicroseconds();
      uVar4 = dVar2 - dVar3;
      *(ulong *)((long)local_58 + lVar5 * 2) = uVar4;
      if (uVar4 <= uVar6 - 1) {
        uVar6 = uVar4;
      }
      if ((lVar5 != 0x10) && ((float)uVar6 * 1.5 < (float)uVar4)) {
        deYield();
        tcu::warmupCPU();
        deYield();
      }
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x14);
    std::__insertion_sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>
              (local_58,&stack0xffffffffffffffd0);
    dVar3 = local_58[2] * 5;
  }
  return dVar3;
}

Assistant:

static deUint64 medianTimeMemcpy (void* dst, const void* src, int numBytes)
{
	// Time used by memcpy is assumed to be asymptotically linear

	// With large numBytes, the probability of context switch or other random
	// event is high. Apply memcpy in parts and report how much time would
	// memcpy have used with the median transfer rate.

	// Less than 1MiB, no need to do anything special
	if (numBytes < 1048576)
	{
		deUint64 startTime;
		deUint64 endTime;

		deYield();

		startTime = deGetMicroseconds();
		deMemcpy(dst, src, numBytes);
		endTime = deGetMicroseconds();

		return endTime - startTime;
	}
	else
	{
		// Do memcpy in multiple parts

		const int	numSections		= 5;
		const int	sectionAlign	= 16;

		int			sectionStarts[numSections+1];
		int			sectionLens[numSections];
		deUint64	sectionTimes[numSections];
		deUint64	medianTime;
		deUint64	bestTime		= 0;

		for (int sectionNdx = 0; sectionNdx < numSections; ++sectionNdx)
			sectionStarts[sectionNdx] = deAlign32((numBytes * sectionNdx / numSections), sectionAlign);
		sectionStarts[numSections] = numBytes;

		for (int sectionNdx = 0; sectionNdx < numSections; ++sectionNdx)
			sectionLens[sectionNdx] = sectionStarts[sectionNdx+1] - sectionStarts[sectionNdx];

		// Memcpy is usually called after mapbuffer range which may take
		// a lot of time. To prevent power management from kicking in during
		// copy, warm up more.
		{
			deYield();
			tcu::warmupCPU();
			deYield();
		}

		for (int sectionNdx = 0; sectionNdx < numSections; ++sectionNdx)
		{
			deUint64 startTime;
			deUint64 endTime;

			startTime = deGetMicroseconds();
			deMemcpy((deUint8*)dst + sectionStarts[sectionNdx], (const deUint8*)src + sectionStarts[sectionNdx], sectionLens[sectionNdx]);
			endTime = deGetMicroseconds();

			sectionTimes[sectionNdx] = endTime - startTime;

			if (!bestTime || sectionTimes[sectionNdx] < bestTime)
				bestTime = sectionTimes[sectionNdx];

			// Detect if write takes 50% longer than it should, and warm up if that happened
			if (sectionNdx != numSections-1 && (float)sectionTimes[sectionNdx] > 1.5f * (float)bestTime)
			{
				deYield();
				tcu::warmupCPU();
				deYield();
			}
		}

		std::sort(sectionTimes, sectionTimes + numSections);

		if ((numSections % 2) == 0)
			medianTime = (sectionTimes[numSections / 2 - 1] + sectionTimes[numSections / 2]) / 2;
		else
			medianTime = sectionTimes[numSections / 2];

		return medianTime*numSections;
	}
}